

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O0

GLuint deqp::gls::FboUtil::config::glCreate(Image *cfg,Functions *gl)

{
  glBindTextureFunc p_Var1;
  GLenum GVar2;
  Texture *local_50;
  long local_40;
  Texture *tex;
  Renderbuffer *rbo;
  Functions *pFStack_18;
  GLuint ret;
  Functions *gl_local;
  Image *cfg_local;
  
  rbo._4_4_ = 0;
  pFStack_18 = gl;
  gl_local = (Functions *)cfg;
  if (cfg == (Image *)0x0) {
    local_40 = 0;
  }
  else {
    local_40 = __dynamic_cast(cfg,&Image::typeinfo,&Renderbuffer::typeinfo,0);
  }
  if (local_40 == 0) {
    if (gl_local == (Functions *)0x0) {
      local_50 = (Texture *)0x0;
    }
    else {
      local_50 = (Texture *)__dynamic_cast(gl_local,&Image::typeinfo,&Texture::typeinfo,0);
    }
    if (local_50 != (Texture *)0x0) {
      (*pFStack_18->genTextures)(1,(GLuint *)((long)&rbo + 4));
      p_Var1 = pFStack_18->bindTexture;
      GVar2 = glTarget(&local_50->super_Image);
      (*p_Var1)(GVar2,rbo._4_4_);
      glInit(local_50,pFStack_18);
      p_Var1 = pFStack_18->bindTexture;
      GVar2 = glTarget(&local_50->super_Image);
      (*p_Var1)(GVar2,0);
    }
  }
  else {
    (*pFStack_18->genRenderbuffers)(1,(GLuint *)((long)&rbo + 4));
    (*pFStack_18->bindRenderbuffer)(0x8d41,rbo._4_4_);
    if (*(int *)(local_40 + 0x18) == 0) {
      (*pFStack_18->renderbufferStorage)
                (0x8d41,*(GLenum *)(local_40 + 8),*(GLsizei *)(local_40 + 0x10),
                 *(GLsizei *)(local_40 + 0x14));
    }
    else {
      (*pFStack_18->renderbufferStorageMultisample)
                (0x8d41,*(GLsizei *)(local_40 + 0x18),*(GLenum *)(local_40 + 8),
                 *(GLsizei *)(local_40 + 0x10),*(GLsizei *)(local_40 + 0x14));
    }
    (*pFStack_18->bindRenderbuffer)(0x8d41,0);
  }
  return rbo._4_4_;
}

Assistant:

static GLuint glCreate (const Image& cfg, const glw::Functions& gl)
{
	GLuint ret = 0;
	if (const Renderbuffer* const rbo = dynamic_cast<const Renderbuffer*>(&cfg))
	{
		gl.genRenderbuffers(1, &ret);
		gl.bindRenderbuffer(GL_RENDERBUFFER, ret);

		if (rbo->numSamples == 0)
			gl.renderbufferStorage(GL_RENDERBUFFER, rbo->internalFormat.format,
								   rbo->width, rbo->height);
		else
			gl.renderbufferStorageMultisample(
				GL_RENDERBUFFER, rbo->numSamples, rbo->internalFormat.format,
				rbo->width, rbo->height);

		gl.bindRenderbuffer(GL_RENDERBUFFER, 0);
	}
	else if (const Texture* const tex = dynamic_cast<const Texture*>(&cfg))
	{
		gl.genTextures(1, &ret);
		gl.bindTexture(glTarget(*tex), ret);
		glInit(*tex, gl);
		gl.bindTexture(glTarget(*tex), 0);
	}
	else
		DE_FATAL("Impossible image type");
	return ret;
}